

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManBuiltInSimResimulate(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int iObj;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->nObjs) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar2 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(pGStack_18);
    if (iVar1 != 0) {
      Gia_ManBuiltInSimPerformInt(p,local_1c);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Gia_ManBuiltInSimResimulate( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;  int iObj;
    Gia_ManForEachAnd( p, pObj, iObj )
        Gia_ManBuiltInSimPerformInt( p, iObj );
}